

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcPropertyEnumeratedValue::~IfcPropertyEnumeratedValue
          (IfcPropertyEnumeratedValue *this)

{
  undefined1 *puVar1;
  bitset<2UL> *pbVar2;
  
  *(undefined ***)&this[-1].field_0x50 = &PTR__IfcPropertyEnumeratedValue_009018e8;
  *(undefined ***)&this->field_0x38 = &PTR__IfcPropertyEnumeratedValue_00901960;
  *(undefined ***)&this[-1].field_0xa8 = &PTR__IfcPropertyEnumeratedValue_00901910;
  *(undefined ***)this = &PTR__IfcPropertyEnumeratedValue_00901938;
  std::
  vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
  ::~vector((vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
             *)&this->field_0x10);
  *(undefined8 *)&this[-1].field_0x50 = 0x901a78;
  *(undefined8 *)&this->field_0x38 = 0x901aa0;
  puVar1 = *(undefined1 **)
            &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyEnumeratedValue,_2UL>.
             field_0x18;
  if ((Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_> *)puVar1 !=
      &this[-1].EnumerationReference) {
    operator_delete(puVar1,(ulong)((long)&(this[-1].EnumerationReference.ptr.obj)->id + 1));
  }
  pbVar2 = &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyEnumeratedValue,_2UL>.
            aux_is_derived;
  if ((bitset<2UL> *)*(undefined1 **)&this[-1].field_0x60 != pbVar2) {
    operator_delete(*(undefined1 **)&this[-1].field_0x60,(pbVar2->super__Base_bitset<1UL>)._M_w + 1)
    ;
  }
  operator_delete(&this[-1].field_0x50,0xb8);
  return;
}

Assistant:

IfcPropertyEnumeratedValue() : Object("IfcPropertyEnumeratedValue") {}